

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser_parseResets_Test::TestBody(Parser_parseResets_Test *this)

{
  undefined4 uVar1;
  char *pcVar2;
  string testValueString;
  string resetValueString;
  string t;
  AssertionResult gtest_ar_5;
  AssertHelper local_c0 [8];
  Message local_b8 [8];
  ResetPtr r;
  ComponentPtr c;
  string rt;
  VariablePtr v2;
  VariablePtr v1;
  ModelPtr model;
  ParserPtr p;
  string in;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\" id=\"mid\">\n  <component name=\"component2\" id=\"c2id\">\n    <variable name=\"variable1\" id=\"vid\"/>\n    <variable name=\"variable2\" id=\"vid2\"/>\n    <reset order=\"1\" id=\"rid\" variable=\"variable1\" test_variable=\"variable2\">\n      <test_value>\n        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n          <apply />\n        </math>\n      </test_value>\n      <reset_value>\n        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n          <apply />\n        </math>\n      </reset_value>\n    </reset>\n  </component>\n</model>\n"
             ,(allocator<char> *)&testValueString);
  libcellml::Parser::create(SUB81(&p,0));
  libcellml::Parser::parseModel((string *)&model);
  libcellml::ComponentEntity::component((ulong)&c);
  t._M_dataplus._M_p = (pointer)0x1;
  resetValueString._M_dataplus._M_p = (pointer)libcellml::Component::resetCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&testValueString,"size_t(1)","c->resetCount()",(unsigned_long *)&t,
             (unsigned_long *)&resetValueString);
  if ((char)testValueString._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&t);
    if (testValueString._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)testValueString._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&resetValueString,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x73c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&resetValueString,(Message *)&t);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&resetValueString);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&t);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&testValueString._M_string_length);
  libcellml::Component::reset((ulong)&r);
  t._M_dataplus._M_p._0_4_ = 1;
  uVar1 = libcellml::Reset::order();
  resetValueString._M_dataplus._M_p._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&testValueString,"1","r->order()",(int *)&t,(int *)&resetValueString);
  if ((char)testValueString._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&t);
    if (testValueString._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)testValueString._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&resetValueString,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x73f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&resetValueString,(Message *)&t);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&resetValueString);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&t);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&testValueString._M_string_length);
  libcellml::Reset::variable();
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&t,"\"variable1\"","v1->name()",(char (*) [10])"variable1",&testValueString
            );
  std::__cxx11::string::~string((string *)&testValueString);
  if ((char)t._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&testValueString);
    if (t._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)t._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&resetValueString,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x742,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&resetValueString,(Message *)&testValueString);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&resetValueString);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&testValueString);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&t._M_string_length);
  libcellml::Reset::testVariable();
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&t,"\"variable2\"","v2->name()",(char (*) [10])"variable2",&testValueString
            );
  std::__cxx11::string::~string((string *)&testValueString);
  if ((char)t._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&testValueString);
    if (t._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)t._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&resetValueString,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x745,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&resetValueString,(Message *)&testValueString);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&resetValueString);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&testValueString);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&t._M_string_length);
  libcellml::Reset::testValue_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t,"<math xmlns=\"http://www.w3.org/1998/Math/MathML\"><apply/></math>\n",
             (allocator<char> *)&resetValueString);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&resetValueString,"t","testValueString",&t,&testValueString);
  if ((char)resetValueString._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&rt);
    if (resetValueString._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)resetValueString._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x74a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&rt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&rt);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&resetValueString._M_string_length);
  libcellml::Reset::resetValue_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rt,"<math xmlns=\"http://www.w3.org/1998/Math/MathML\"><apply/></math>\n",
             (allocator<char> *)&gtest_ar_5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_5,"rt","resetValueString",&rt,&resetValueString);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message(local_b8);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x74f,pcVar2);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  std::__cxx11::string::~string((string *)&rt);
  std::__cxx11::string::~string((string *)&resetValueString);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::~string((string *)&testValueString);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&in);
  return;
}

Assistant:

TEST(Parser, parseResets)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\" id=\"mid\">\n"
        "  <component name=\"component2\" id=\"c2id\">\n"
        "    <variable name=\"variable1\" id=\"vid\"/>\n"
        "    <variable name=\"variable2\" id=\"vid2\"/>\n"
        "    <reset order=\"1\" id=\"rid\" variable=\"variable1\" test_variable=\"variable2\">\n"
        "      <test_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </test_value>\n"
        "      <reset_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </reset_value>\n"
        "    </reset>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(in);

    libcellml::ComponentPtr c = model->component(0);
    EXPECT_EQ(size_t(1), c->resetCount());

    libcellml::ResetPtr r = c->reset(0);
    EXPECT_EQ(1, r->order());

    libcellml::VariablePtr v1 = r->variable();
    EXPECT_EQ("variable1", v1->name());

    libcellml::VariablePtr v2 = r->testVariable();
    EXPECT_EQ("variable2", v2->name());

    std::string testValueString = r->testValue();
    std::string t =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\"><apply/></math>\n";
    EXPECT_EQ(t, testValueString);

    std::string resetValueString = r->resetValue();
    std::string rt =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\"><apply/></math>\n";
    EXPECT_EQ(rt, resetValueString);
}